

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uinvchar.cpp
# Opt level: O0

int32_t uprv_compareInvEbcdic_63
                  (UDataSwapper *ds,char *outString,int32_t outLength,UChar *localString,
                  int32_t localLength)

{
  size_t sVar1;
  UChar32 local_48;
  uint local_40;
  uint uStack_3c;
  uint8_t c;
  UChar32 c2;
  UChar32 c1;
  int32_t minLength;
  int32_t localLength_local;
  UChar *localString_local;
  byte *pbStack_20;
  int32_t outLength_local;
  char *outString_local;
  UDataSwapper *ds_local;
  
  if ((((outString == (char *)0x0) || (outLength < -1)) || (localString == (UChar *)0x0)) ||
     (localLength < -1)) {
    ds_local._4_4_ = 0;
  }
  else {
    localString_local._4_4_ = outLength;
    if (outLength < 0) {
      sVar1 = strlen(outString);
      localString_local._4_4_ = (int32_t)sVar1;
    }
    c1 = localLength;
    if (localLength < 0) {
      c1 = u_strlen_63(localString);
    }
    if (localString_local._4_4_ < c1) {
      local_48 = localString_local._4_4_;
    }
    else {
      local_48 = c1;
    }
    _minLength = localString;
    pbStack_20 = (byte *)outString;
    for (c2 = local_48; 0 < c2; c2 = c2 + -1) {
      if (*pbStack_20 == 0) {
        uStack_3c = 0;
      }
      else {
        uStack_3c = (uint)""[*pbStack_20];
        if (((uStack_3c == 0) || (0x7f < uStack_3c)) ||
           ((invariantChars[(int)uStack_3c >> 5] & 1 << (""[*pbStack_20] & 0x1f)) == 0)) {
          uStack_3c = 0xffffffff;
        }
      }
      local_40 = (uint)(ushort)*_minLength;
      if ((0x7f < local_40) ||
         ((invariantChars[(int)local_40 >> 5] & 1 << ((byte)*_minLength & 0x1f)) == 0)) {
        local_40 = 0xfffffffe;
      }
      if (uStack_3c - local_40 != 0) {
        return uStack_3c - local_40;
      }
      _minLength = _minLength + 1;
      pbStack_20 = pbStack_20 + 1;
    }
    ds_local._4_4_ = localString_local._4_4_ - c1;
  }
  return ds_local._4_4_;
}

Assistant:

U_CFUNC int32_t
uprv_compareInvEbcdic(const UDataSwapper *ds,
                      const char *outString, int32_t outLength,
                      const UChar *localString, int32_t localLength) {
    (void)ds;
    int32_t minLength;
    UChar32 c1, c2;
    uint8_t c;

    if(outString==NULL || outLength<-1 || localString==NULL || localLength<-1) {
        return 0;
    }

    if(outLength<0) {
        outLength=(int32_t)uprv_strlen(outString);
    }
    if(localLength<0) {
        localLength=u_strlen(localString);
    }

    minLength= outLength<localLength ? outLength : localLength;

    while(minLength>0) {
        c=(uint8_t)*outString++;
        if(c==0) {
            c1=0;
        } else if((c1=asciiFromEbcdic[c])!=0 && UCHAR_IS_INVARIANT(c1)) {
            /* c1 is set */
        } else {
            c1=-1;
        }

        c2=*localString++;
        if(!UCHAR_IS_INVARIANT(c2)) {
            c2=-2;
        }

        if((c1-=c2)!=0) {
            return c1;
        }

        --minLength;
    }

    /* strings start with same prefix, compare lengths */
    return outLength-localLength;
}